

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O3

void roaring_bitmap_remove_many(roaring_bitmap_t *r,size_t n_args,uint32_t *vals)

{
  ushort uVar1;
  uint uVar2;
  uint16_t *puVar3;
  uint8_t uVar4;
  int *c;
  int *piVar5;
  long lVar6;
  ushort uVar7;
  size_t sVar8;
  uint uVar9;
  int iVar10;
  uint uVar11;
  ulong uVar12;
  uint8_t new_typecode;
  uint8_t local_41;
  size_t local_40;
  uint32_t *local_38;
  
  if ((n_args != 0) && ((r->high_low_container).size != 0)) {
    uVar12 = 0xffffffff;
    sVar8 = 0;
    local_40 = n_args;
    local_38 = vals;
    do {
      uVar2 = local_38[sVar8];
      uVar7 = (ushort)(uVar2 >> 0x10);
      if (((int)uVar12 < 0) || (uVar2 >> 0x10 != (uint)(r->high_low_container).keys[uVar12])) {
        iVar10 = (r->high_low_container).size;
        if (((long)iVar10 != 0) &&
           (puVar3 = (r->high_low_container).keys, puVar3[(long)iVar10 + -1] != uVar7)) {
          if (0 < iVar10) {
            iVar10 = iVar10 + -1;
            uVar9 = 0;
            do {
              uVar11 = iVar10 + uVar9 >> 1;
              uVar12 = (ulong)uVar11;
              uVar1 = *(ushort *)((long)puVar3 + (ulong)(iVar10 + uVar9 & 0xfffffffe));
              if (uVar1 < uVar7) {
                uVar9 = uVar11 + 1;
              }
              else {
                if (uVar1 <= uVar7) goto LAB_001145fd;
                iVar10 = uVar11 - 1;
              }
            } while ((int)uVar9 <= iVar10);
            uVar9 = ~uVar9;
            goto LAB_001145f1;
          }
          goto LAB_00114714;
        }
        uVar9 = iVar10 - 1;
LAB_001145f1:
        uVar12 = (ulong)uVar9;
        if (-1 < (int)uVar9) goto LAB_001145fd;
      }
      else {
LAB_001145fd:
        c = (int *)container_remove((r->high_low_container).containers[uVar12],(uint16_t)uVar2,
                                    (r->high_low_container).typecodes[uVar12],&local_41);
        piVar5 = (int *)(r->high_low_container).containers[uVar12];
        if (c != piVar5) {
          container_free(piVar5,(r->high_low_container).typecodes[uVar12]);
          if ((r->high_low_container).size <= (int)uVar12) {
            __assert_fail("i < ra->size",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/RoaringBitmap[P]croaring_cmake_demo_from_single_header/dependencies/croaring/roaring.c"
                          ,0x1a55,
                          "void ra_replace_key_and_container_at_index(roaring_array_t *, int32_t, uint16_t, container_t *, uint8_t)"
                         );
          }
          (r->high_low_container).keys[uVar12] = uVar7;
          (r->high_low_container).containers[uVar12] = c;
          (r->high_low_container).typecodes[uVar12] = local_41;
        }
        piVar5 = c;
        uVar4 = local_41;
        if (local_41 == '\x04') {
          uVar4 = (uint8_t)c[2];
          if (uVar4 == '\x04') {
            __assert_fail("*type != SHARED_CONTAINER_TYPE",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/RoaringBitmap[P]croaring_cmake_demo_from_single_header/dependencies/croaring/roaring.c"
                          ,0x1062,
                          "const container_t *container_unwrap_shared(const container_t *, uint8_t *)"
                         );
          }
          piVar5 = *(int **)c;
        }
        if ((uVar4 == '\x03') || (uVar4 == '\x02')) {
          if (0 < *piVar5) goto LAB_0011471a;
        }
        else {
          if (uVar4 != '\x01') {
            __assert_fail("false",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/RoaringBitmap[P]croaring_cmake_demo_from_single_header/dependencies/croaring/roaring.c"
                          ,0x11c6,
                          "_Bool container_nonzero_cardinality(const container_t *, uint8_t)");
          }
          if (*piVar5 != 0) {
            if (*piVar5 != -1) goto LAB_0011471a;
            lVar6 = 0;
            do {
              if (*(long *)(*(long *)(piVar5 + 2) + lVar6 * 8) != 0) goto LAB_0011471a;
              lVar6 = lVar6 + 1;
            } while (lVar6 != 0x400);
          }
        }
        container_free(c,local_41);
        ra_remove_at_index(&r->high_low_container,(int)uVar12);
LAB_00114714:
        uVar12 = 0xffffffff;
      }
LAB_0011471a:
      sVar8 = sVar8 + 1;
    } while (sVar8 != local_40);
  }
  return;
}

Assistant:

void roaring_bitmap_remove_many(roaring_bitmap_t *r, size_t n_args,
                                const uint32_t *vals) {
    if (n_args == 0 || r->high_low_container.size == 0) {
        return;
    }
    int32_t pos = -1; // position of the container used in the previous iteration
    for (size_t i = 0; i < n_args; i++) {
        uint16_t key = (uint16_t)(vals[i] >> 16);
        if (pos < 0 || key != r->high_low_container.keys[pos]) {
            pos = ra_get_index(&r->high_low_container, key);
        }
        if (pos >= 0) {
            uint8_t new_typecode;
            container_t *new_container;
            new_container = container_remove(r->high_low_container.containers[pos],
                                             vals[i] & 0xffff,
                                             r->high_low_container.typecodes[pos],
                                             &new_typecode);
            if (new_container != r->high_low_container.containers[pos]) {
                container_free(r->high_low_container.containers[pos],
                               r->high_low_container.typecodes[pos]);
                ra_replace_key_and_container_at_index(&r->high_low_container,
                                                      pos, key, new_container,
                                                      new_typecode);
            }
            if (!container_nonzero_cardinality(new_container, new_typecode)) {
                container_free(new_container, new_typecode);
                ra_remove_at_index(&r->high_low_container, pos);
                pos = -1;
            }
        }
    }
}